

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall google::LogMessage::SendToLog(LogMessage *this)

{
  LogSeverity severity;
  LogMessageData *pLVar1;
  ulong uVar2;
  long *plVar3;
  bool bVar4;
  char *pcVar5;
  int line;
  long lVar6;
  char *base_filename;
  char *pcVar7;
  LogMessage *this_00;
  size_t sVar8;
  size_t __n;
  byte bVar9;
  char w [66];
  
  bVar9 = 0;
  sVar8 = this->data_->num_chars_to_log_;
  if ((sVar8 == 0) || (this->data_->message_text_[sVar8 - 1] != '\n')) {
    RawLog__(FATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
             ,0x6d4,"Check %s failed: %s",
             "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_ - 1] == \'\\n\'"
             ,"");
  }
  if ((SendToLog()::already_warned_before_initgoogle == '\0') &&
     (bVar4 = IsGoogleLoggingInitialized(), !bVar4)) {
    pcVar5 = "WARNING: Logging before InitGoogleLogging() is written to STDERR\n";
    pcVar7 = w;
    for (lVar6 = 0x42; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pcVar7 = *pcVar5;
      pcVar5 = pcVar5 + (ulong)bVar9 * -2 + 1;
      pcVar7 = pcVar7 + (ulong)bVar9 * -2 + 1;
    }
    WriteToStderr(w,0x41);
    SendToLog()::already_warned_before_initgoogle = '\x01';
  }
  if (((fLB::FLAGS_logtostderr == '\0') && ((fLB::FLAGS_logtostdout & 1) == 0)) &&
     (bVar4 = IsGoogleLoggingInitialized(), bVar4)) {
    pLVar1 = this->data_;
    LogDestination::LogToAllLogfiles
              (pLVar1->severity_,&(this->time_).timestamp_,pLVar1->message_text_,
               pLVar1->num_chars_to_log_);
    pLVar1 = this->data_;
    LogDestination::MaybeLogToStderr
              (pLVar1->severity_,pLVar1->message_text_,pLVar1->num_chars_to_log_,
               pLVar1->num_prefix_chars_);
    pLVar1 = this->data_;
    LogDestination::MaybeLogToEmail
              (pLVar1->severity_,pLVar1->message_text_,pLVar1->num_chars_to_log_);
    pLVar1 = this->data_;
    pcVar7 = pLVar1->fullname_;
    base_filename = pLVar1->basename_;
    severity = pLVar1->severity_;
    line = pLVar1->line_;
    pcVar5 = pLVar1->message_text_ + (pLVar1->num_prefix_chars_ - 4);
    sVar8 = ~pLVar1->num_prefix_chars_ + pLVar1->num_chars_to_log_;
  }
  else {
    pLVar1 = this->data_;
    if ((fLB::FLAGS_logtostdout & 1) == 0) {
      ColoredWriteToStderr(pLVar1->severity_,pLVar1->message_text_,pLVar1->num_chars_to_log_);
    }
    else {
      ColoredWriteToStdout(pLVar1->severity_,pLVar1->message_text_,pLVar1->num_chars_to_log_);
    }
    pLVar1 = this->data_;
    pcVar7 = pLVar1->fullname_;
    base_filename = pLVar1->basename_;
    severity = pLVar1->severity_;
    line = pLVar1->line_;
    pcVar5 = pLVar1->message_text_ + (pLVar1->num_prefix_chars_ - 4);
    sVar8 = ~pLVar1->num_prefix_chars_ + pLVar1->num_chars_to_log_;
  }
  this_00 = (LogMessage *)(ulong)severity;
  LogDestination::LogToSinks(severity,pcVar7,base_filename,line,&this->time_,pcVar5 + 4,sVar8);
  if ((this->data_->severity_ == FATAL) && (exit_on_dfatal == '\x01')) {
    if (this->data_->first_fatal_ == true) {
      RecordCrashReason(this_00,(CrashReason *)crash_reason);
      glog_internal_namespace_::SetCrashReason((CrashReason *)crash_reason);
      uVar2 = this->data_->num_chars_to_log_;
      __n = 0xff;
      if (uVar2 < 0xff) {
        __n = uVar2;
      }
      memcpy(&fatal_message,this->data_->message_text_,__n);
      (&fatal_message)[__n] = 0;
      fatal_time = (this->time_).timestamp_.__d.__r;
    }
    if ((fLB::FLAGS_logtostderr == '\0') && (fLB::FLAGS_logtostdout == 0)) {
      for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
        if (*(long *)((long)&LogDestination::log_destinations_ + lVar6) != 0) {
          plVar3 = *(long **)(*(long *)((long)&LogDestination::log_destinations_ + lVar6) + 200);
          w[0] = '\0';
          w[1] = '\0';
          w[2] = '\0';
          w[3] = '\0';
          w[4] = '\0';
          w[5] = '\0';
          w[6] = '\0';
          w[7] = '\0';
          (**(code **)(*plVar3 + 0x18))(plVar3,1,w,"",0);
        }
      }
    }
    std::mutex::unlock((mutex *)log_mutex);
    LogDestination::WaitForSinks(this->data_);
    write(2,"*** Check failure stack trace: ***\n",0x23);
    pcVar5 = glog_internal_namespace_::ProgramInvocationShortName();
    glog_internal_namespace_::AlsoErrorWrite(FATAL,pcVar5,"*** Check failure stack trace: ***\n");
    (*(code *)g_logging_fail_func)();
    return;
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  static bool already_warned_before_initgoogle = false;

  RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
                 data_->message_text_[data_->num_chars_to_log_ - 1] == '\n',
             "");

  // Messages of a given severity get logged to lower severity logs, too

  if (!already_warned_before_initgoogle && !IsGoogleLoggingInitialized()) {
    const char w[] =
        "WARNING: Logging before InitGoogleLogging() is "
        "written to STDERR\n";
    WriteToStderr(w, strlen(w));
    already_warned_before_initgoogle = true;
  }

  // global flag: never log to file if set.  Also -- don't log to a
  // file if we haven't parsed the command line flags to get the
  // program name.
  if (FLAGS_logtostderr || FLAGS_logtostdout || !IsGoogleLoggingInitialized()) {
    if (FLAGS_logtostdout) {
      ColoredWriteToStdout(data_->severity_, data_->message_text_,
                           data_->num_chars_to_log_);
    } else {
      ColoredWriteToStderr(data_->severity_, data_->message_text_,
                           data_->num_chars_to_log_);
    }

    // this could be protected by a flag if necessary.
    LogDestination::LogToSinks(
        data_->severity_, data_->fullname_, data_->basename_, data_->line_,
        time_, data_->message_text_ + data_->num_prefix_chars_,
        (data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1));
  } else {
    // log this message to all log files of severity <= severity_
    LogDestination::LogToAllLogfiles(data_->severity_, time_.when(),
                                     data_->message_text_,
                                     data_->num_chars_to_log_);

    LogDestination::MaybeLogToStderr(data_->severity_, data_->message_text_,
                                     data_->num_chars_to_log_,
                                     data_->num_prefix_chars_);
    LogDestination::MaybeLogToEmail(data_->severity_, data_->message_text_,
                                    data_->num_chars_to_log_);
    LogDestination::LogToSinks(
        data_->severity_, data_->fullname_, data_->basename_, data_->line_,
        time_, data_->message_text_ + data_->num_prefix_chars_,
        (data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1));
    // NOTE: -1 removes trailing \n
  }

  // If we log a FATAL message, flush all the log destinations, then toss
  // a signal for others to catch. We leave the logs in a state that
  // someone else can use them (as long as they flush afterwards)
  if (data_->severity_ == GLOG_FATAL && exit_on_dfatal) {
    if (data_->first_fatal_) {
      // Store crash information so that it is accessible from within signal
      // handlers that may be invoked later.
      RecordCrashReason(&crash_reason);
      SetCrashReason(&crash_reason);

      // Store shortened fatal message for other logs and GWQ status
      const size_t copy =
          min(data_->num_chars_to_log_, sizeof(fatal_message) - 1);
      memcpy(fatal_message, data_->message_text_, copy);
      fatal_message[copy] = '\0';
      fatal_time = time_.when();
    }

    if (!FLAGS_logtostderr && !FLAGS_logtostdout) {
      for (auto& log_destination : LogDestination::log_destinations_) {
        if (log_destination) {
          log_destination->logger_->Write(
              true, std::chrono::system_clock::time_point{}, "", 0);
        }
      }
    }

    // release the lock that our caller (directly or indirectly)
    // LogMessage::~LogMessage() grabbed so that signal handlers
    // can use the logging facility. Alternately, we could add
    // an entire unsafe logging interface to bypass locking
    // for signal handlers but this seems simpler.
    log_mutex.unlock();
    LogDestination::WaitForSinks(data_);

    const char* message = "*** Check failure stack trace: ***\n";
    if (write(STDERR_FILENO, message, strlen(message)) < 0) {
      // Ignore errors.
    }
    AlsoErrorWrite(GLOG_FATAL,
                   glog_internal_namespace_::ProgramInvocationShortName(),
                   message);
    Fail();
  }
}